

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O1

void alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
     build_node_implicit_sampling
               (V *values,int num_keys,int sample_num_keys,int sample_data_capacity,int step_size,
               StatAccumulator *ent,LinearModel<int> *sample_model)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int j;
  long lVar8;
  long lVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 in_XMM2_Qb;
  
  if (0 < num_keys) {
    uVar10 = sample_data_capacity - 1;
    uVar7 = 0xffffffff;
    lVar9 = 0;
    do {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = sample_model->a_;
      auVar13._0_8_ = (double)values[lVar9].first;
      auVar13._8_8_ = in_XMM2_Qb;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = sample_model->b_;
      auVar1 = vfmadd213sd_fma(auVar13,auVar11,auVar1);
      uVar6 = (int)auVar1._0_8_;
      if ((int)uVar10 < (int)auVar1._0_8_) {
        uVar6 = uVar10;
      }
      uVar6 = ~((int)uVar6 >> 0x1f) & uVar6;
      uVar3 = uVar7 + 1;
      if ((int)(uVar7 + 1) < (int)uVar6) {
        uVar3 = uVar6;
      }
      if ((int)(sample_data_capacity - uVar3) < sample_num_keys) {
        uVar6 = sample_data_capacity - sample_num_keys;
        lVar8 = lVar9;
        do {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = sample_model->a_;
          auVar14._0_8_ = (double)values[lVar8].first;
          auVar14._8_8_ = in_XMM2_Qb;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = sample_model->b_;
          auVar1 = vfmadd213sd_fma(auVar14,auVar12,auVar2);
          uVar4 = uVar10;
          if ((int)auVar1._0_8_ <= (int)uVar10) {
            uVar4 = (int)auVar1._0_8_;
          }
          (*ent->_vptr_StatAccumulator[2])(ent,(ulong)uVar6,(ulong)(~((int)uVar4 >> 0x1f) & uVar4));
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + step_size;
          iVar5 = sample_num_keys;
        } while (lVar8 < (long)(ulong)(uint)num_keys);
      }
      else {
        (*ent->_vptr_StatAccumulator[2])(ent,(ulong)uVar3);
        iVar5 = sample_num_keys + -1;
        uVar7 = uVar3;
      }
    } while ((sample_num_keys <= (int)(sample_data_capacity - uVar3)) &&
            (lVar9 = lVar9 + step_size, sample_num_keys = iVar5, lVar9 < (long)(ulong)(uint)num_keys
            ));
  }
  return;
}

Assistant:

static void build_node_implicit_sampling(const V* values, int num_keys,
                                           int sample_num_keys,
                                           int sample_data_capacity,
                                           int step_size, StatAccumulator* ent,
                                           const LinearModel<T>* sample_model) {
    int last_position = -1;
    int sample_keys_remaining = sample_num_keys;
    for (int i = 0; i < num_keys; i += step_size) {
      int predicted_position =
          std::max(0, std::min(sample_data_capacity - 1,
                               sample_model->predict(values[i].first)));
      int actual_position =
          std::max<int>(predicted_position, last_position + 1);
      int positions_remaining = sample_data_capacity - actual_position;
      if (positions_remaining < sample_keys_remaining) {
        actual_position = sample_data_capacity - sample_keys_remaining;
        for (int j = i; j < num_keys; j += step_size) {
          predicted_position =
              std::max(0, std::min(sample_data_capacity - 1,
                                   sample_model->predict(values[j].first)));
          ent->accumulate(actual_position, predicted_position);
          actual_position++;
        }
        break;
      }
      ent->accumulate(actual_position, predicted_position);
      last_position = actual_position;
      sample_keys_remaining--;
    }
  }